

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  long lVar1;
  int val;
  undefined8 uVar2;
  long lVar3;
  int *bitCntP;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  float *pfVar13;
  uint uVar14;
  bool bVar15;
  unsigned_short bits [2];
  unsigned_short local_160 [2];
  unsigned_short local_15c [2];
  int *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  int DU [64];
  
  lVar8 = (long)du_stride;
  pfVar13 = CDU + 7;
  local_15c = *HTAC;
  local_160 = HTAC[0xf0];
  local_150 = fdtbl;
  for (lVar10 = 0; lVar10 < (long)(ulong)(uint)(du_stride << 3); lVar10 = lVar10 + lVar8) {
    stbiw__jpg_DCT(pfVar13 + -7,pfVar13 + -6,pfVar13 + -5,pfVar13 + -4,pfVar13 + -3,pfVar13 + -2,
                   pfVar13 + -1,pfVar13);
    pfVar13 = pfVar13 + lVar8;
  }
  local_148 = CDU + (uint)(du_stride * 4);
  local_140 = CDU + du_stride * 3;
  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 4) {
    stbiw__jpg_DCT((float *)((long)CDU + lVar10),(float *)((long)CDU + lVar10 + lVar8 * 4),
                   (float *)((long)CDU + lVar10 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)local_140 + lVar10),(float *)((long)local_148 + lVar10),
                   (float *)((long)CDU + lVar10 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar10 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar10 + (long)(du_stride * 7) * 4));
  }
  lVar6 = 0;
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
    lVar6 = (long)(int)lVar6;
    lVar9 = 0;
    while (lVar9 != 8) {
      pfVar13 = CDU + lVar9;
      lVar1 = lVar6 + lVar9;
      lVar3 = lVar6 + lVar9;
      lVar9 = lVar9 + 1;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)(*pfVar13 * local_150[lVar3])),ZEXT816(0) << 0x40,1);
      bVar15 = (bool)((byte)uVar2 & 1);
      DU[""[lVar1]] =
           (int)(*pfVar13 * local_150[lVar3] +
                (float)((uint)bVar15 * -0x41000000 + (uint)!bVar15 * 0x3f000000));
    }
    CDU = CDU + lVar8;
    lVar6 = lVar6 + 8;
  }
  if (DU[0] - DC != 0) {
    stbiw__jpg_calcBits(DU[0] - DC,bits);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[bits[1]]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  iVar5 = 0;
  uVar11 = 0x3f;
  while( true ) {
    if ((int)uVar11 == 0) goto LAB_002444df;
    if (DU[uVar11 & 0xffffffff] != 0) break;
    iVar5 = iVar5 + 1;
    uVar11 = uVar11 - 1;
  }
  local_158 = bitCnt;
  for (iVar4 = 1; bitCntP = local_158, iVar4 <= (int)uVar11; iVar4 = iVar4 + 1 + uVar7) {
    lVar8 = (long)iVar4;
    uVar7 = 0xffffffff;
    uVar14 = 0;
    do {
      uVar12 = uVar14;
      val = DU[lVar8];
      uVar7 = uVar7 + 1;
      if ((long)uVar11 < lVar8) break;
      lVar8 = lVar8 + 1;
      uVar14 = uVar12 + 1;
    } while (val == 0);
    uVar14 = uVar7;
    if (0xf < (int)uVar7) {
      uVar12 = uVar12 >> 4;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        stbiw__jpg_writeBits(s,bitBuf,bitCntP,local_160);
      }
      uVar14 = uVar7 & 0xf;
    }
    stbiw__jpg_calcBits(val,bits);
    bitCnt = local_158;
    stbiw__jpg_writeBits(s,bitBuf,local_158,HTAC[(long)(int)(uVar14 << 4) + (ulong)bits[1]]);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
  }
  if (iVar5 != 0) {
LAB_002444df:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,local_15c);
  }
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}